

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void assignment(LexState *ls,LHS_assign *lh,int nvars)

{
  expdesc *var;
  int *piVar1;
  FuncState *pFVar2;
  Instruction *pIVar3;
  bool bVar4;
  int iVar5;
  expdesc e;
  undefined1 local_48 [8];
  expdesc local_40;
  
  if (3 < (lh->v).k - VLOCAL) {
    luaX_lexerror(ls,"syntax error",(ls->t).token);
  }
  var = &lh->v;
  iVar5 = testnext(ls,0x2c);
  if (iVar5 == 0) {
    checknext(ls,0x3d);
    iVar5 = explist1(ls,(expdesc *)local_48);
    if (nvars == iVar5) {
      pFVar2 = ls->fs;
      if (local_48._0_4_ == VVARARG) {
        pIVar3 = pFVar2->f->code;
        pIVar3[(int)local_40.k] = pIVar3[(int)local_40.k] & 0x7fffff | 0x1000000;
        local_48._0_4_ = 0xb;
      }
      else if (local_48._0_4_ == VCALL) {
        local_48._0_4_ = 0xc;
        local_40.k = pFVar2->f->code[(int)local_40.k] >> 6 & 0xff;
      }
      luaK_storevar(pFVar2,var,(expdesc *)local_48);
    }
    else {
      adjust_assign(ls,nvars,iVar5,(expdesc *)local_48);
      if (nvars < iVar5) {
        piVar1 = &ls->fs->freereg;
        *piVar1 = *piVar1 + (nvars - iVar5);
      }
    }
    if (nvars == iVar5) {
      return;
    }
  }
  else {
    local_48 = (undefined1  [8])lh;
    primaryexp(ls,&local_40);
    if ((local_40.k == VLOCAL) && (lh != (LHS_assign *)0x0)) {
      pFVar2 = ls->fs;
      iVar5 = pFVar2->freereg;
      bVar4 = false;
      do {
        if ((lh->v).k == VINDEXED) {
          if ((lh->v).u.s.info == local_40.u.s.info) {
            (lh->v).u.s.info = iVar5;
            bVar4 = true;
          }
          if ((lh->v).u.s.aux == local_40.u.s.info) {
            (lh->v).u.s.aux = iVar5;
            bVar4 = true;
          }
        }
        lh = lh->prev;
      } while (lh != (LHS_assign *)0x0);
      if (bVar4) {
        luaK_code(pFVar2,local_40.u.s.info << 0x17 | pFVar2->freereg << 6,pFVar2->ls->lastline);
        luaK_checkstack(pFVar2,1);
        pFVar2->freereg = pFVar2->freereg + 1;
      }
    }
    iVar5 = 200 - (uint)ls->L->nCcalls;
    if (iVar5 < nvars) {
      errorlimit(ls->fs,iVar5,"variables in assignment");
    }
    assignment(ls,(LHS_assign *)local_48,nvars + 1);
  }
  local_40.k = ls->fs->freereg - VNIL;
  local_40.u.nval = -NAN;
  local_48._0_4_ = 0xc;
  luaK_storevar(ls->fs,var,(expdesc *)local_48);
  return;
}

Assistant:

static void assignment(LexState*ls,struct LHS_assign*lh,int nvars){
expdesc e;
check_condition(ls,VLOCAL<=lh->v.k&&lh->v.k<=VINDEXED,
"syntax error");
if(testnext(ls,',')){
struct LHS_assign nv;
nv.prev=lh;
primaryexp(ls,&nv.v);
if(nv.v.k==VLOCAL)
check_conflict(ls,lh,&nv.v);
luaY_checklimit(ls->fs,nvars,200-ls->L->nCcalls,
"variables in assignment");
assignment(ls,&nv,nvars+1);
}
else{
int nexps;
checknext(ls,'=');
nexps=explist1(ls,&e);
if(nexps!=nvars){
adjust_assign(ls,nvars,nexps,&e);
if(nexps>nvars)
ls->fs->freereg-=nexps-nvars;
}
else{
luaK_setoneret(ls->fs,&e);
luaK_storevar(ls->fs,&lh->v,&e);
return;
}
}
init_exp(&e,VNONRELOC,ls->fs->freereg-1);
luaK_storevar(ls->fs,&lh->v,&e);
}